

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall InstructionGenerator::genCompareLessThanOrEqual(InstructionGenerator *this)

{
  allocator local_c1;
  undefined1 local_c0 [48];
  string local_90;
  undefined1 local_70 [48];
  undefined1 local_40 [48];
  
  local_c0._0_4_ = 0x14;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,(Instruction *)local_c0);
  local_c0._0_4_ = INT;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
            (this->bytecode,(int *)local_c0);
  VirtualStack::pop((Variable *)local_40,&this->super_VirtualStack);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  VirtualStack::pop((Variable *)local_70,&this->super_VirtualStack);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  std::__cxx11::string::string((string *)&local_90,"",&local_c1);
  Variable::Variable((Variable *)local_c0,&local_90,BOOL);
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_c0);
  std::__cxx11::string::~string((string *)(local_c0 + 8));
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void InstructionGenerator::genCompareLessThanOrEqual()
{
    bytecode->emplace_back(Instruction::COMPARE_LESS_THAN_OR_EQUAL);
    bytecode->emplace_back(0);
    pop();
    pop();
    push(Variable("", DataType::BOOL));
}